

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O3

void __thiscall QWidgetLineControl::resetCursorBlinkTimer(QWidgetLineControl *this)

{
  uint uVar1;
  
  if ((((byte)this[0x51] & 4) != 0) && (*(int *)(this + 0x54) != 0)) {
    QBasicTimer::stop();
    QGuiApplication::styleHints();
    uVar1 = QStyleHints::cursorFlashTime();
    if (1 < (int)uVar1) {
      QBasicTimer::start(this + 0x54,(ulong)(uVar1 >> 1) * 1000000,1,this);
    }
    this[0x51] = (QWidgetLineControl)((byte)this[0x51] | 2);
  }
  return;
}

Assistant:

void QWidgetLineControl::resetCursorBlinkTimer()
{
    if (!m_blinkEnabled || !m_blinkTimer.isActive())
        return;
    m_blinkTimer.stop();
    const auto flashTime = QGuiApplication::styleHints()->cursorFlashTime() * 1ms;
    if (flashTime >= 2ms)
        m_blinkTimer.start(flashTime / 2, this);
    m_blinkStatus = 1;
}